

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint _h;
  int iVar2;
  pointer pMVar3;
  Mat *this_00;
  size_t sVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  void *pvVar15;
  ulong uVar16;
  void *pvVar17;
  ulong uVar18;
  int iVar19;
  void *pvVar20;
  long lVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 in_XMM2 [16];
  undefined1 auVar26 [16];
  float fVar27;
  long local_258;
  void *local_250;
  int *local_230;
  long *local_228;
  long local_218;
  int local_204;
  long local_200;
  pointer local_1f8;
  pointer local_1e8;
  int *local_1e0;
  Mat local_1d8;
  Mat *local_190;
  long local_188;
  long local_180;
  long local_178;
  pointer local_170;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar3;
  local_1e8 = pMVar3;
  local_1f8 = pMVar3;
  if (lVar5 == 0x48) {
    iVar8 = this->attn_mask;
LAB_004dffd0:
    if (iVar8 == 0) {
      local_250 = (void *)0x0;
      local_230 = (int *)0x0;
      lVar21 = 0;
      local_228 = (long *)0x0;
      local_204 = 0;
      iVar8 = 0;
      local_200 = 0;
      goto LAB_004e0084;
    }
  }
  else {
    iVar8 = this->attn_mask;
    if (iVar8 == 0 || lVar5 != 0x90) {
      local_1f8 = pMVar3 + 1;
      local_1e8 = local_1f8;
      if (iVar8 == 0) {
        local_1e8 = pMVar3 + 2;
      }
      if (lVar5 != 0xd8) {
        local_1e8 = pMVar3 + 2;
      }
      if (lVar5 == 0x90) {
        local_1e8 = local_1f8;
      }
      goto LAB_004dffd0;
    }
  }
  local_250 = *(void **)((long)pMVar3 + lVar5 + -0x48);
  local_230 = *(int **)((long)pMVar3 + lVar5 + -0x40);
  lVar21 = *(long *)((long)pMVar3 + lVar5 + -0x38);
  local_228 = *(long **)((long)pMVar3 + lVar5 + -0x28);
  local_204 = *(int *)((long)pMVar3 + lVar5 + -0x20);
  iVar8 = *(int *)((long)pMVar3 + lVar5 + -0x1c);
  local_200 = *(long *)((long)pMVar3 + lVar5 + -8);
  if (local_230 == (int *)0x0) {
    local_230 = (int *)0x0;
  }
  else {
    LOCK();
    *local_230 = *local_230 + 1;
    UNLOCK();
  }
LAB_004e0084:
  local_1e0 = &this->attn_mask;
  uVar1 = pMVar3->h;
  uVar12 = (ulong)uVar1;
  _h = local_1f8->h;
  uVar22 = (ulong)_h;
  uVar16 = (long)this->embed_dim / (long)this->num_heads;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->embed_dim,uVar1,4,opt->blob_allocator);
  iVar19 = -1;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    iVar19 = (int)uVar16;
    local_190 = this_00;
    Mat::create(&local_c8,iVar19,uVar1,this->num_heads,4,opt->workspace_allocator);
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    Mat::create(&local_118,iVar19,_h,this->num_heads,4,opt->workspace_allocator);
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,_h,iVar19,this->num_heads,4,opt->workspace_allocator);
    local_1d8.cstep = 0;
    local_1d8.data = (void *)0x0;
    local_1d8.refcount._0_4_ = 0;
    local_1d8.refcount._4_4_ = 0;
    local_1d8.elemsize._0_4_ = 0;
    local_1d8.elemsize._4_4_ = 0;
    local_1d8.elempack = 0;
    local_1d8.allocator = (Allocator *)0x0;
    local_1d8.dims = 0;
    local_1d8.w = 0;
    local_1d8.h = 0;
    local_1d8.d = 0;
    local_1d8.c = 0;
    Mat::create(&local_1d8,_h,uVar1,this->num_heads,4,opt->workspace_allocator);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    local_170 = pMVar3;
    Mat::create(&local_78,iVar19,this->num_heads,uVar1,4,opt->workspace_allocator);
    if (0 < this->num_heads) {
      auVar26 = rsqrtss(in_XMM2,ZEXT416((uint)(float)iVar19));
      fVar25 = auVar26._0_4_;
      lVar5 = (long)iVar19;
      uVar16 = uVar16 & 0xffffffff;
      local_188 = lVar5 * 4;
      local_180 = iVar8 * lVar21;
      local_218 = 0;
      local_258 = 0;
      do {
        if (0 < (int)uVar1) {
          iVar8 = this->embed_dim;
          pvVar11 = (this->q_bias_data).data;
          pvVar13 = (this->q_weight_data).data;
          uVar14 = 0;
          do {
            if (0 < iVar19) {
              iVar2 = local_170->w;
              sVar4 = local_170->elemsize;
              pvVar15 = local_170->data;
              uVar18 = 0;
              pvVar17 = (void *)(local_218 * iVar8 + (long)pvVar13);
              do {
                fVar23 = *(float *)((long)pvVar11 + (local_258 * lVar5 + uVar18) * 4);
                if (0 < iVar8) {
                  lVar7 = 0;
                  do {
                    fVar23 = fVar23 + *(float *)((long)pvVar17 + lVar7 * 4) *
                                      *(float *)((long)pvVar15 +
                                                lVar7 * 4 + sVar4 * uVar14 * (long)iVar2);
                    lVar7 = lVar7 + 1;
                  } while (iVar8 != (int)lVar7);
                }
                *(float *)((long)local_c8.data +
                          uVar18 * 4 +
                          (long)local_c8.w *
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * uVar14 +
                          local_c8.cstep * local_258 *
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)) =
                     fVar23 * fVar25 * -0.5 * ((float)iVar19 * fVar25 * fVar25 + -3.0);
                uVar18 = uVar18 + 1;
                pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * 4);
              } while (uVar18 != uVar16);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar12);
        }
        if (0 < (int)_h) {
          iVar8 = this->kdim;
          pvVar11 = (this->k_bias_data).data;
          pvVar13 = (this->k_weight_data).data;
          uVar14 = 0;
          do {
            if (0 < iVar19) {
              iVar2 = local_1f8->w;
              sVar4 = local_1f8->elemsize;
              pvVar15 = local_1f8->data;
              uVar18 = 0;
              pvVar17 = (void *)(local_218 * iVar8 + (long)pvVar13);
              do {
                fVar23 = *(float *)((long)pvVar11 + (local_258 * lVar5 + uVar18) * 4);
                if (0 < iVar8) {
                  lVar7 = 0;
                  do {
                    fVar23 = fVar23 + *(float *)((long)pvVar17 + lVar7 * 4) *
                                      *(float *)((long)pvVar15 +
                                                lVar7 * 4 + sVar4 * uVar14 * (long)iVar2);
                    lVar7 = lVar7 + 1;
                  } while (iVar8 != (int)lVar7);
                }
                *(float *)((long)local_118.data +
                          uVar18 * 4 +
                          (long)local_118.w *
                          CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) * uVar14
                          + local_118.cstep * local_258 *
                            CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize)) =
                     fVar23;
                uVar18 = uVar18 + 1;
                pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * 4);
              } while (uVar18 != uVar16);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar22);
        }
        if (0 < iVar19) {
          iVar8 = this->vdim;
          pvVar11 = (this->v_bias_data).data;
          pvVar13 = (void *)(local_218 * iVar8 + (long)(this->v_weight_data).data);
          uVar14 = 0;
          do {
            if (0 < (int)_h) {
              pvVar15 = local_1e8->data;
              iVar2 = local_1e8->w;
              sVar4 = local_1e8->elemsize;
              uVar18 = 0;
              do {
                fVar23 = *(float *)((long)pvVar11 + (uVar14 + local_258 * lVar5) * 4);
                if (0 < iVar8) {
                  lVar7 = 0;
                  do {
                    fVar23 = fVar23 + *(float *)((long)pvVar13 + lVar7 * 4) *
                                      *(float *)((long)pvVar15 + lVar7 * 4);
                    lVar7 = lVar7 + 1;
                  } while (iVar8 != (int)lVar7);
                }
                *(float *)((long)local_168.data +
                          uVar18 * 4 +
                          (long)local_168.w *
                          CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) * uVar14
                          + local_168.cstep * local_258 *
                            CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize)) =
                     fVar23;
                uVar18 = uVar18 + 1;
                pvVar15 = (void *)((long)pvVar15 + (long)iVar2 * sVar4);
              } while (uVar18 != uVar22);
            }
            uVar14 = uVar14 + 1;
            pvVar13 = (void *)((long)pvVar13 + (long)iVar8 * 4);
          } while (uVar14 != uVar16);
        }
        if (0 < (int)uVar1) {
          pvVar11 = (void *)(local_c8.cstep *
                             CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                             local_258 + (long)local_c8.data);
          uVar14 = 0;
          do {
            if (0 < (int)_h) {
              uVar18 = 0;
              pvVar13 = (void *)(CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) *
                                 local_118.cstep * local_258 + (long)local_118.data);
              do {
                fVar23 = 0.0;
                if (0 < iVar19) {
                  lVar7 = 0;
                  do {
                    fVar23 = fVar23 + *(float *)((long)pvVar13 + lVar7 * 4) *
                                      *(float *)((long)pvVar11 + lVar7 * 4);
                    lVar7 = lVar7 + 1;
                  } while (iVar19 != (int)lVar7);
                }
                *(float *)((long)local_1d8.data +
                          uVar18 * 4 +
                          (long)local_1d8.w *
                          CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize) * uVar14
                          + local_1d8.cstep * local_258 *
                            CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize)) =
                     fVar23;
                uVar18 = uVar18 + 1;
                pvVar13 = (void *)((long)pvVar13 +
                                  (long)local_118.w *
                                  CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize))
                ;
              } while (uVar18 != uVar22);
            }
            uVar14 = uVar14 + 1;
            pvVar11 = (void *)((long)pvVar11 +
                              (long)local_c8.w *
                              CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
          } while (uVar14 != uVar12);
        }
        if (*local_1e0 != 0) {
          if (local_204 == 3) {
            piVar6 = (int *)0x0;
            pvVar11 = (void *)(local_200 * lVar21 * local_258 + (long)local_250);
          }
          else {
            pvVar11 = local_250;
            if (local_230 == (int *)0x0) {
              piVar6 = (int *)0x0;
            }
            else {
              LOCK();
              *local_230 = *local_230 + 1;
              UNLOCK();
              piVar6 = local_230;
            }
          }
          if (0 < (int)uVar1) {
            pvVar15 = (void *)(CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize) *
                               local_1d8.cstep * local_258 + (long)local_1d8.data);
            uVar14 = 0;
            pvVar13 = pvVar11;
            do {
              if (0 < (int)_h) {
                uVar18 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar18 * 4) =
                       *(float *)((long)pvVar15 + uVar18 * 4) +
                       *(float *)((long)pvVar13 + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar22 != uVar18);
              }
              uVar14 = uVar14 + 1;
              pvVar15 = (void *)((long)pvVar15 +
                                (long)local_1d8.w *
                                CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize));
              pvVar13 = (void *)((long)pvVar13 + local_180);
            } while (uVar14 != uVar12);
          }
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_228 == (long *)0x0) {
                if (pvVar11 != (void *)0x0) {
                  free(pvVar11);
                }
              }
              else {
                (**(code **)(*local_228 + 0x18))();
              }
            }
          }
        }
        lVar7 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        if ((int)uVar1 < 1) {
          lVar9 = local_1d8.cstep * local_258 * lVar7;
        }
        else {
          lVar9 = local_1d8.w * lVar7;
          pvVar11 = (void *)((long)local_1d8.data + local_1d8.cstep * lVar7 * local_258);
          uVar14 = 0;
          local_178 = lVar9;
          do {
            if (0 < (int)_h) {
              uVar18 = 0;
              fVar23 = -3.4028235e+38;
              do {
                fVar27 = *(float *)((long)pvVar11 + uVar18 * 4);
                if (fVar23 <= fVar27) {
                  fVar23 = fVar27;
                }
                uVar18 = uVar18 + 1;
              } while (uVar22 != uVar18);
              if (0 < (int)_h) {
                fVar27 = 0.0;
                uVar18 = 0;
                do {
                  fVar24 = expf(*(float *)((long)pvVar11 + uVar18 * 4) - fVar23);
                  *(float *)((long)pvVar11 + uVar18 * 4) = fVar24;
                  fVar27 = fVar27 + fVar24;
                  uVar18 = uVar18 + 1;
                } while (uVar22 != uVar18);
                lVar9 = local_178;
                if (0 < (int)_h) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar11 + uVar18 * 4) =
                         *(float *)((long)pvVar11 + uVar18 * 4) * (1.0 / fVar27);
                    uVar18 = uVar18 + 1;
                  } while (uVar22 != uVar18);
                }
              }
            }
            uVar14 = uVar14 + 1;
            pvVar11 = (void *)((long)pvVar11 + lVar9);
          } while (uVar14 != uVar12);
          lVar7 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
          lVar9 = local_1d8.cstep * local_258 * lVar7;
        }
        if (0 < (int)uVar1) {
          lVar9 = (long)local_1d8.data + lVar9;
          uVar14 = 0;
          do {
            if (0 < iVar19) {
              uVar18 = 0;
              pvVar11 = (void *)(CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) *
                                 local_168.cstep * local_258 + (long)local_168.data);
              do {
                fVar23 = 0.0;
                if (0 < (int)_h) {
                  lVar10 = 0;
                  do {
                    fVar23 = fVar23 + *(float *)((long)pvVar11 + lVar10 * 4) *
                                      *(float *)(lVar9 + lVar10 * 4);
                    lVar10 = lVar10 + 1;
                  } while (_h != (uint)lVar10);
                }
                *(float *)((long)local_78.data +
                          uVar18 * 4 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * uVar14 +
                          local_78.w * local_258 *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize)) = fVar23;
                uVar18 = uVar18 + 1;
                pvVar11 = (void *)((long)pvVar11 +
                                  (long)local_168.w *
                                  CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize))
                ;
              } while (uVar18 != uVar16);
            }
            uVar14 = uVar14 + 1;
            lVar9 = lVar9 + lVar7 * local_1d8.w;
          } while (uVar14 != uVar12);
        }
        local_258 = local_258 + 1;
        local_218 = local_218 + local_188;
      } while (local_258 < this->num_heads);
    }
    if (0 < (int)uVar1) {
      pvVar11 = local_190->data;
      iVar8 = local_190->w;
      sVar4 = local_190->elemsize;
      uVar1 = this->embed_dim;
      pvVar13 = (this->out_weight_data).data;
      pvVar15 = (this->out_bias_data).data;
      uVar16 = 0;
      pvVar17 = local_78.data;
      do {
        if (0 < (int)uVar1) {
          uVar22 = 0;
          pvVar20 = pvVar13;
          do {
            fVar25 = *(float *)((long)pvVar15 + uVar22 * 4);
            lVar5 = 0;
            do {
              fVar25 = fVar25 + *(float *)((long)pvVar20 + lVar5 * 4) *
                                *(float *)((long)pvVar17 + lVar5 * 4);
              lVar5 = lVar5 + 1;
            } while (uVar1 != (uint)lVar5);
            *(float *)((long)pvVar11 + uVar22 * 4 + (long)iVar8 * sVar4 * uVar16) = fVar25;
            uVar22 = uVar22 + 1;
            pvVar20 = (void *)((long)pvVar20 + (long)(int)uVar1 * 4);
          } while (uVar22 != uVar1);
        }
        uVar16 = uVar16 + 1;
        pvVar17 = (void *)((long)pvVar17 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
      } while (uVar16 != uVar12);
    }
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar6 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_1d8.allocator == (Allocator *)0x0) {
          if (local_1d8.data != (void *)0x0) {
            free(local_1d8.data);
          }
        }
        else {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar6 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar6 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar19 = 0;
  }
  if (local_230 != (int *)0x0) {
    LOCK();
    *local_230 = *local_230 + -1;
    UNLOCK();
    if (*local_230 == 0) {
      if (local_228 == (long *)0x0) {
        if (local_250 != (void *)0x0) {
          free(local_250);
        }
      }
      else {
        (**(code **)(*local_228 + 0x18))(local_228,local_250);
      }
    }
  }
  return iVar19;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    const int src_seqlen = q_blob.h;
    const int dst_seqlen = k_blob.h;
    const int embed_dim_per_head = embed_dim / num_heads;

    // assert k_blob.h == v_blob.h

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, src_seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, dst_seqlen, num_heads, 4u, opt.workspace_allocator);
    Mat xv(dst_seqlen, embed_dim_per_head, num_heads, 4u, opt.workspace_allocator);

    Mat xqk(dst_seqlen, src_seqlen, num_heads, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_heads, src_seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrtf(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_heads; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < dst_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + kdim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < kdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + vdim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < vdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, src_seqlen)
        // xk  (embed_dim_per_head, dst_seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xqk + mask
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob.dims == 3 ? attn_mask_blob.channel(q) : attn_mask_blob;
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                const float* mptr = maskm.row(i);
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    outptr[j] += mptr[j];
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] = (float)(expf(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (dst_seqlen, src_seqlen)
        // xv  (dst_seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_heads, src_seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < dst_seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, src_seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < src_seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}